

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::ObjectGet(VirtualMachine *this)

{
  element_type *peVar1;
  iterator iVar2;
  Variable VVar3;
  Variable VVar4;
  
  VVar3 = popOpStack(this);
  VVar4 = popOpStack(this);
  if ((VVar4.type == Object) && (VVar3.type == String)) {
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)VVar4.field_1.objectValue,(key_type *)VVar3.field_1.objectValue);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_true>
        ._M_cur != (__node_type *)0x0) {
      VVar3._4_4_ = 0;
      VVar3.type = *(uint *)((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_true>
                                   ._M_cur + 0x28);
      VVar3.field_1.integerValue =
           ((anon_union_8_6_52c89740_for_Variable_1 *)
           ((long)iVar2.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_runtime::Variable>,_true>
                  ._M_cur + 0x30))->integerValue;
      pushOpStack(this,VVar3);
      goto LAB_001188b2;
    }
  }
  pushUndefined(this);
LAB_001188b2:
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::ObjectGet() {

  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (first.type != VariableType::Object) {
    this->pushUndefined();
    this->advance();
    return;
  }

  if (second.type != VariableType::String) {
    this->pushUndefined();
    this->advance();
    return;
  }

  auto find = first.objectValue->properties.find(*second.stringValue);

  if (find == first.objectValue->properties.end()) {
    this->pushUndefined();
  } else {
    this->pushOpStack(find->second);
  }

  this->advance();
}